

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

word Npn_TruthCanon(word t,int nVars,int *pPhase)

{
  int iVar1;
  int local_48;
  int CanonPhase;
  int fChange;
  int v;
  char pCanonPerm [6];
  char pSigs [13];
  char Temp;
  int fUsePermutation;
  int fUsePolarity;
  int *pPhase_local;
  word wStack_10;
  int nVars_local;
  word t_local;
  
  local_48 = 0;
  if (nVars < 7) {
    iVar1 = Npn_TruthCountOnes(t);
    wStack_10 = t;
    if (' ' < (char)iVar1) {
      wStack_10 = t ^ 0xffffffffffffffff;
      local_48 = 0x40;
    }
    if (pPhase != (int *)0x0) {
      *pPhase = 0;
      for (CanonPhase = 0; CanonPhase < nVars; CanonPhase = CanonPhase + 1) {
        *pPhase = (int)*(char *)((long)&fChange + (long)CanonPhase) <<
                  ((byte)(CanonPhase << 2) & 0x1f) | *pPhase;
      }
      *pPhase = local_48 << 0x18 | *pPhase;
    }
    return wStack_10;
  }
  __assert_fail("nVars < 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNpnSave.c"
                ,0x120,"word Npn_TruthCanon(word, int, int *)");
}

Assistant:

static inline word Npn_TruthCanon( word t, int nVars, int * pPhase )
{
    int fUsePolarity    = 0;
    int fUsePermutation = 0;
    char Temp, pSigs[13], pCanonPerm[6];
    int v, fChange, CanonPhase = 0;
    assert( nVars < 7 );
    pSigs[12] = Npn_TruthCountOnes( t );
    if ( pSigs[12] > 32 )
    {
        t = ~t;
        pSigs[12] = 64 - pSigs[12];
        CanonPhase |= (1 << 6);
    }
    if ( fUsePolarity || fUsePermutation )
    {
        for ( v = 0; v < nVars; v++ )
        {
            pCanonPerm[v] = v;
            pSigs[2*v+1] = Npn_TruthCountOnes( t & Truth[v] );
            pSigs[2*v] = pSigs[12] - pSigs[2*v+1];
        }
    }
    if ( fUsePolarity )
    {
        for ( v = 0; v < nVars; v++ )
        {
            if ( pSigs[2*v] >= pSigs[2*v+1] )
                continue;
            CanonPhase |= (1 << v);
            Temp = pSigs[2*v];
            pSigs[2*v] = pSigs[2*v+1];
            pSigs[2*v+1] = Temp;
            t = Npn_TruthChangePhase( t, v );
        }
    }
    if ( fUsePermutation )
    {
        do {
            fChange = 0;
            for ( v = 0; v < nVars-1; v++ )
            {
                if ( fUsePolarity )
                {
                    if ( pSigs[2*v] >= pSigs[2*(v+1)] )
                        continue;
                }
                else
                {
                    if ( Abc_MinInt(pSigs[2*v],pSigs[2*v+1]) >= Abc_MinInt(pSigs[2*(v+1)],pSigs[2*(v+1)+1]) )
                        continue;
                }
                fChange = 1;

                Temp = pCanonPerm[v];
                pCanonPerm[v] = pCanonPerm[v+1];
                pCanonPerm[v+1] = Temp;

                Temp = pSigs[2*v];
                pSigs[2*v] = pSigs[2*(v+1)];
                pSigs[2*(v+1)] = Temp;

                Temp = pSigs[2*v+1];
                pSigs[2*v+1] = pSigs[2*(v+1)+1];
                pSigs[2*(v+1)+1] = Temp;

                t = Npn_TruthSwapAdjacentVars( t, v );
            }
        } while ( fChange );
    }
    if ( pPhase )
    {
        *pPhase = 0;
        for ( v = 0; v < nVars; v++ )
            *pPhase |= (pCanonPerm[v] << (4 * v));
        *pPhase |= (CanonPhase << 24);
    }
    return t;
}